

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::mouseMoveEvent(QAbstractSpinBox *this,QMouseEvent *event)

{
  long lVar1;
  Int IVar2;
  bool bVar3;
  KeyboardModifiers KVar4;
  undefined4 uVar5;
  QFlagsStorage<QAbstractSpinBox::StepEnabledFlag> QVar6;
  Int IVar7;
  QAbstractSpinBoxPrivate *this_00;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  int __fd;
  QPoint *in_RSI;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *d;
  StepEnabled se;
  StepEnabledFlag in_stack_ffffffffffffff9c;
  StepEnabledFlag other;
  QAbstractSpinBoxPrivate *this_01;
  QFlags local_34 [2];
  bool fromKeyboard;
  bool up;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QAbstractSpinBox *)0x689e5f);
  KVar4 = QInputEvent::modifiers((QInputEvent *)in_RDI);
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (Int)KVar4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
            super_QFlagsStorage<Qt::KeyboardModifier>.i;
  QSinglePointEvent::position((QSinglePointEvent *)0x689e95);
  QPointF::toPoint((QPointF *)this_00);
  QAbstractSpinBoxPrivate::updateHoverControl(this_01,in_RSI);
  bVar3 = QBasicTimer::isActive(&this_00->spinClickTimer);
  if ((bVar3) && (this_00->buttonSymbols != NoButtons)) {
    uVar5 = (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1c8))();
    QVar6.i = (Int)QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                             ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)in_RDI,
                              in_stack_ffffffffffffff9c);
    IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffd0);
    IVar2 = _local_34;
    __addr_len = (socklen_t *)(ulong)IVar7;
    other = in_stack_ffffffffffffff9c & 0xffffff;
    if (IVar7 != 0) {
      other = CONCAT13(this_00->hoverControl == SC_ComboBoxFrame,(int3)in_stack_ffffffffffffff9c);
    }
    if ((char)(other >> 0x18) == '\0') {
      __fd = 2;
      _local_34 = (Int)QFlags<QAbstractSpinBox::StepEnabledFlag>::operator&
                                 ((QFlags<QAbstractSpinBox::StepEnabledFlag> *)in_RDI,other);
      IVar7 = ::QFlags::operator_cast_to_unsigned_int(local_34);
      __addr_len = (socklen_t *)(ulong)IVar7;
      bVar3 = false;
      if (IVar7 != 0) {
        bVar3 = this_00->hoverControl == SC_ComboBoxEditField;
      }
      if (bVar3) {
        __fd = 0;
        QAbstractSpinBoxPrivate::updateState
                  ((QAbstractSpinBoxPrivate *)CONCAT44(uVar5,QVar6.i),up,fromKeyboard);
        __addr = extraout_RDX_00;
      }
      else {
        QAbstractSpinBoxPrivate::reset(in_RDI);
        __addr = extraout_RDX_01;
      }
    }
    else {
      __fd = 1;
      up = SUB41(_local_34 >> 0x18,0);
      fromKeyboard = SUB41(IVar2 >> 0x10,0);
      QAbstractSpinBoxPrivate::updateState
                ((QAbstractSpinBoxPrivate *)CONCAT44(uVar5,QVar6.i),up,fromKeyboard);
      _local_34 = IVar2;
      __addr = extraout_RDX;
    }
    QEvent::accept((QEvent *)in_RSI,__fd,__addr,__addr_len);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();
    d->updateHoverControl(event->position().toPoint());

    // If we have a timer ID, update the state
    if (d->spinClickTimer.isActive() && d->buttonSymbols != NoButtons) {
        const StepEnabled se = stepEnabled();
        if ((se & StepUpEnabled) && d->hoverControl == QStyle::SC_SpinBoxUp)
            d->updateState(true);
        else if ((se & StepDownEnabled) && d->hoverControl == QStyle::SC_SpinBoxDown)
            d->updateState(false);
        else
            d->reset();
        event->accept();
    }
}